

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::custom_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          function<void_(unsigned_int_&,_unsigned_int)> *per_pixel_fn)

{
  function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
  *y_00;
  Image *pIVar1;
  long y_01;
  uint32_t uVar2;
  ulong uVar3;
  function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
  *r;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long extraout_RDX;
  ulong uVar7;
  long lVar8;
  Image *pIVar9;
  Image *pIVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lStack_168;
  uint64_t uStack_160;
  unsigned_long uStack_158;
  unsigned_long uStack_150;
  unsigned_long uStack_148;
  unsigned_long uStack_140;
  ulong uStack_138;
  long lStack_130;
  ulong uStack_128;
  long lStack_120;
  ulong uStack_118;
  Image *pIStack_110;
  Image *pIStack_108;
  ulong uStack_100;
  long lStack_f8;
  ssize_t sStack_f0;
  long lStack_e8;
  uint64_t uStack_e0;
  uint64_t uStack_d8;
  uint64_t uStack_d0;
  ulong uStack_c8;
  function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
  *pfStack_c0;
  Image *pIStack_b8;
  Image *pIStack_b0;
  function<void_(unsigned_int_&,_unsigned_int)> *pfStack_a8;
  code *pcStack_a0;
  ulong uStack_90;
  undefined4 uStack_88;
  uint local_84;
  function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
  *local_80;
  uint32_t local_74;
  ulong local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  Image *local_40;
  function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
  *local_38;
  
  lVar8 = source->width;
  if (w < 0) {
    w = lVar8;
  }
  lVar16 = source->height;
  if (h < 0) {
    h = lVar16;
  }
  uVar11 = sx >> 0x3f & sx;
  uVar5 = x - uVar11;
  uVar6 = 0;
  if (sx < 1) {
    sx = uVar6;
  }
  uVar13 = sy >> 0x3f & sy;
  uVar3 = y - uVar13;
  if (sy < 1) {
    sy = uVar6;
  }
  local_50 = 0;
  if (0 < (long)uVar5) {
    local_50 = uVar5;
  }
  if (-1 < (long)uVar5) {
    uVar5 = uVar6;
  }
  uVar11 = uVar11 + w + uVar5;
  local_48 = sx - uVar5;
  uVar5 = 0;
  if (0 < (long)uVar3) {
    uVar5 = uVar3;
  }
  if (-1 < (long)uVar3) {
    uVar3 = uVar6;
  }
  uVar13 = uVar13 + h + uVar3;
  local_60 = sy - uVar3;
  uVar6 = lVar8 - local_48;
  if ((long)(uVar11 + local_48) <= lVar8) {
    uVar6 = uVar11;
  }
  uVar11 = lVar16 - local_60;
  if ((long)(uVar13 + local_60) <= lVar16) {
    uVar11 = uVar13;
  }
  uVar3 = this->width - local_50;
  if ((long)(uVar6 + local_50) <= this->width) {
    uVar3 = uVar6;
  }
  local_58 = this->height - uVar5;
  if ((long)(uVar11 + uVar5) <= this->height) {
    local_58 = uVar11;
  }
  if (0 < (long)local_58 && -1 < (long)(local_58 | uVar3)) {
    local_80 = (function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
                *)0x0;
    local_70 = uVar3;
    local_68 = uVar5;
    local_40 = source;
    do {
      if (0 < (long)local_70) {
        local_38 = local_80 + local_60;
        y_00 = local_80 + local_68;
        lVar8 = 0;
        r = local_80;
        do {
          pcStack_a0 = (code *)0x10b644;
          uVar2 = read_pixel(local_40,local_48 + lVar8,(ssize_t)local_38);
          pIVar1 = (Image *)(local_50 + lVar8);
          pcStack_a0 = (code *)0x10b65d;
          pIVar9 = pIVar1;
          pIVar10 = this;
          local_84 = read_pixel(this,(ssize_t)pIVar1,(ssize_t)y_00);
          local_74 = uVar2;
          if (*(long *)(per_pixel_fn + 0x10) == 0) {
            pcStack_a0 = custom_blit;
            ::std::__throw_bad_function_call();
            pfStack_a8 = per_pixel_fn;
            uVar6 = pIVar9->width;
            if ((long)uVar5 < 0) {
              uVar5 = uVar6;
            }
            uVar11 = pIVar9->height;
            if ((long)uVar3 < 0) {
              uVar3 = uVar11;
            }
            uVar12 = (long)uStack_90 >> 0x3f & uStack_90;
            uVar13 = extraout_RDX - uVar12;
            uVar7 = 0;
            if ((long)uStack_90 < 1) {
              uStack_90 = uVar7;
            }
            uVar15 = CONCAT44(local_84,uStack_88);
            uVar14 = (long)(int)local_84 >> 0x1f & uVar15;
            uVar4 = (long)r - uVar14;
            if ((long)uVar15 < 1) {
              uVar15 = uVar7;
            }
            uStack_100 = 0;
            if (0 < (long)uVar13) {
              uStack_100 = uVar13;
            }
            if (-1 < (long)uVar13) {
              uVar13 = uVar7;
            }
            uVar5 = uVar12 + uVar5 + uVar13;
            lVar16 = uStack_90 - uVar13;
            uStack_138 = 0;
            if (0 < (long)uVar4) {
              uStack_138 = uVar4;
            }
            if (-1 < (long)uVar4) {
              uVar4 = uVar7;
            }
            uVar13 = uVar14 + uVar3 + uVar4;
            lStack_130 = uVar15 - uVar4;
            uVar3 = uVar6 - lVar16;
            if ((long)(uVar5 + lVar16) <= (long)uVar6) {
              uVar3 = uVar5;
            }
            uVar5 = uVar11 - lStack_130;
            if ((long)(uVar13 + lStack_130) <= (long)uVar11) {
              uVar5 = uVar13;
            }
            uVar6 = pIVar10->width - uStack_100;
            if ((long)(uVar3 + uStack_100) <= pIVar10->width) {
              uVar6 = uVar3;
            }
            uStack_128 = pIVar10->height - uStack_138;
            if ((long)(uVar5 + uStack_138) <= pIVar10->height) {
              uStack_128 = uVar5;
            }
            if (0 < (long)uStack_128 && -1 < (long)(uStack_128 | uVar6)) {
              lStack_168 = 0;
              lStack_120 = lVar16;
              uStack_118 = uVar6;
              pIStack_110 = pIVar9;
              pIStack_108 = pIVar10;
              uStack_c8 = (ulong)uVar2;
              pfStack_c0 = y_00;
              pIStack_b8 = pIVar1;
              pIStack_b0 = this;
              pcStack_a0 = (code *)lVar8;
              do {
                if (0 < (long)uVar6) {
                  sStack_f0 = lStack_130 + lStack_168;
                  lStack_f8 = uStack_138 + lStack_168;
                  lVar8 = 0;
                  do {
                    read_pixel(pIStack_110,lVar16 + lVar8,sStack_f0,&uStack_140,&uStack_148,
                               &uStack_150,&uStack_158);
                    y_01 = lStack_f8;
                    pIVar1 = pIStack_108;
                    lStack_e8 = uStack_100 + lVar8;
                    read_pixel(pIStack_108,lStack_e8,lStack_f8,&uStack_d0,&uStack_d8,&uStack_e0,
                               &uStack_160);
                    ::std::
                    function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
                    ::operator()(local_80,&uStack_d0,&uStack_d8,&uStack_e0,&uStack_160,uStack_140,
                                 uStack_148,uStack_150,uStack_158);
                    lVar16 = lStack_120;
                    write_pixel(pIVar1,lStack_e8,y_01,uStack_d0,uStack_d8,uStack_e0,uStack_160);
                    lVar8 = lVar8 + 1;
                    uVar6 = uStack_118;
                  } while (lVar8 < (long)uStack_118);
                }
                lStack_168 = lStack_168 + 1;
              } while (lStack_168 < (long)uStack_128);
            }
            return;
          }
          pcStack_a0 = (code *)0x10b67d;
          (**(code **)(per_pixel_fn + 0x18))(per_pixel_fn,&local_84,&local_74);
          r = (function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
               *)(ulong)(local_84 >> 0x18);
          uVar5 = (ulong)(local_84 >> 0x10 & 0xff);
          uVar3 = (ulong)(local_84 >> 8 & 0xff);
          pcStack_a0 = (code *)0x10b6b2;
          write_pixel(this,(ssize_t)pIVar1,(ssize_t)y_00,(uint64_t)r,uVar5,uVar3,
                      (ulong)(local_84 & 0xff));
          lVar8 = lVar8 + 1;
        } while (lVar8 < (long)local_70);
      }
      local_80 = local_80 + 1;
    } while ((long)local_80 < (long)local_58);
  }
  return;
}

Assistant:

void Image::custom_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy,
    function<void(uint32_t&, uint32_t)> per_pixel_fn) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint32_t sc = source.read_pixel(sx + xx, sy + yy);
      uint32_t dc = this->read_pixel(x + xx, y + yy);
      per_pixel_fn(dc, sc);
      this->write_pixel(x + xx, y + yy, dc);
    }
  }
}